

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O1

string * nivalis::latex_to_nivalis(string *__return_storage_ptr__,string *expr_in)

{
  byte bVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  char *pcVar8;
  ulong uVar9;
  size_type *psVar10;
  ulong uVar11;
  allocator_type *paVar12;
  byte c;
  long lVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  long *in_FS_OFFSET;
  bool bVar17;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  string_view src_08;
  string_view src_09;
  string_view src_10;
  string_view src_11;
  string_view src_12;
  string_view src_13;
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  initializer_list<char> __l_05;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_06;
  initializer_list<char> __l_07;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_08;
  initializer_list<char> __l_09;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_10;
  initializer_list<char> __l_11;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_12;
  initializer_list<char> __l_13;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_14;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  string_view to_08;
  string_view to_09;
  string_view to_10;
  string_view to_11;
  string expr;
  string tmp_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __result;
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [8];
  _Alloc_hider local_3c0;
  undefined1 local_3b8 [24];
  undefined4 local_3a0;
  undefined1 *local_398;
  undefined8 local_390;
  undefined1 local_388 [16];
  undefined4 local_378;
  long *local_370 [2];
  long local_360 [2];
  undefined4 local_350;
  undefined1 *local_348;
  undefined8 local_340;
  undefined1 local_338 [16];
  undefined4 local_328;
  long *local_320 [2];
  long local_310 [2];
  ulong local_300;
  string local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  string local_2b8;
  string *local_298;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((char)in_FS_OFFSET[-0x7c] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x86] = lVar13 + -0x420;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x430),"\\sqrt","");
    local_408._M_dataplus._M_p._0_2_ = 0x7b5b;
    paVar12 = (allocator_type *)local_2d8;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x410),__l,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"(","");
    local_398 = local_388;
    local_3a0 = 1;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,")^(1/(","");
    local_348 = local_338;
    local_350 = 0;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"))","");
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x3f8),__l_00,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x430,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x7c) = 1;
  }
  if ((char)in_FS_OFFSET[-0x71] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x7b] = lVar13 + -0x3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x3d8),"\\sqrt","");
    local_408._M_dataplus._M_p._0_1_ = 0x7b;
    paVar12 = (allocator_type *)local_2d8;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x3b8),__l_01,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"sqrt(","");
    local_398 = local_388;
    local_3a0 = 0;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    plVar7 = local_360;
    local_370[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,")","");
    __l_02._M_len = 3;
    __l_02._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x3a0),__l_02,(allocator_type *)paVar12);
    lVar13 = -0x78;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x3d8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x71) = 1;
  }
  if ((char)in_FS_OFFSET[-0x66] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x70] = lVar13 + -0x370;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x380),"\\frac","");
    local_408._M_dataplus._M_p._0_2_ = 0x7b7b;
    paVar12 = (allocator_type *)local_2d8;
    __l_03._M_len = 2;
    __l_03._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x360),__l_03,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"((","");
    local_398 = local_388;
    local_3a0 = 0;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,")/(","");
    local_348 = local_338;
    local_350 = 1;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"))","");
    __l_04._M_len = 5;
    __l_04._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x348),__l_04,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x380,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x66) = 1;
  }
  if ((char)in_FS_OFFSET[-0x5b] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x65] = lVar13 + -0x318;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x328),"\\log_","");
    local_408._M_dataplus._M_p._0_2_ = 0x287b;
    paVar12 = (allocator_type *)local_2d8;
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x308),__l_05,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"log(","");
    local_398 = local_388;
    local_3a0 = 1;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,", ","");
    local_348 = local_338;
    local_350 = 0;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,")","");
    __l_06._M_len = 5;
    __l_06._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x2f0),__l_06,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x328,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x5b) = 1;
  }
  if ((char)in_FS_OFFSET[-0x50] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x5a] = lVar13 + -0x2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x2d0),"\\sum_","");
    local_408._M_dataplus._M_p._0_2_ = 0x5e7b;
    paVar12 = (allocator_type *)local_2d8;
    __l_07._M_len = 2;
    __l_07._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x2b0),__l_07,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"sum(","");
    local_398 = local_388;
    local_3a0 = 0;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,", ","");
    local_348 = local_338;
    local_350 = 1;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,")\v","");
    __l_08._M_len = 5;
    __l_08._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x298),__l_08,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x2d0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x50) = 1;
  }
  if ((char)in_FS_OFFSET[-0x45] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x4f] = lVar13 + -0x268;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x278),"\\prod_","");
    local_408._M_dataplus._M_p._0_2_ = 0x5e7b;
    paVar12 = (allocator_type *)local_2d8;
    __l_09._M_len = 2;
    __l_09._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -600),__l_09,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"prod(","");
    local_398 = local_388;
    local_3a0 = 0;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,", ","");
    local_348 = local_338;
    local_350 = 1;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,")\v","");
    __l_10._M_len = 5;
    __l_10._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x240),__l_10,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x278,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x45) = 1;
  }
  if ((char)in_FS_OFFSET[-0x3a] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x44] = lVar13 + -0x210;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x220),"\\int_","");
    local_408._M_dataplus._M_p._0_2_ = 0x5e7b;
    paVar12 = (allocator_type *)local_2d8;
    __l_11._M_len = 2;
    __l_11._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x200),__l_11,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"int(","");
    local_398 = local_388;
    local_3a0 = 0;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,", ","");
    local_348 = local_338;
    local_350 = 1;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,")\v","");
    __l_12._M_len = 5;
    __l_12._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -0x1e8),__l_12,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x220,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x3a) = 1;
  }
  if ((char)in_FS_OFFSET[-0x2f] == '\0') {
    lVar13 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x39] = lVar13 + -0x1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(lVar13 + -0x1c8),"\\binom","");
    local_408._M_dataplus._M_p._0_2_ = 0x7b7b;
    paVar12 = (allocator_type *)local_2d8;
    __l_13._M_len = 2;
    __l_13._M_array = (iterator)&local_408;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(lVar13 + -0x1a8),__l_13,paVar12);
    local_3c8._0_4_ = 0xffffffff;
    local_3c0._M_p = local_3b8 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"choose(","");
    local_398 = local_388;
    local_3a0 = 0;
    local_390 = 0;
    local_388[0] = 0;
    local_378 = 0xffffffff;
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,", ","");
    local_348 = local_338;
    local_350 = 1;
    local_340 = 0;
    local_338[0] = 0;
    local_328 = 0xffffffff;
    plVar7 = local_310;
    local_320[0] = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,")","");
    __l_14._M_len = 5;
    __l_14._M_array = (iterator)local_3c8;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)(*in_FS_OFFSET + -400),__l_14,(allocator_type *)paVar12);
    lVar13 = -200;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -5;
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x1c8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x2f) = 1;
  }
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  pcVar2 = (expr_in->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,pcVar2,pcVar2 + expr_in->_M_string_length);
  util::trim(&local_408);
  sVar4 = local_408._M_string_length;
  if ((char *)local_408._M_string_length == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    goto LAB_00113cf7;
  }
  if (local_408._M_string_length < (char *)0x6) {
LAB_001126d0:
    bVar17 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_2d8,(ulong)&local_408);
    iVar5 = std::__cxx11::string::compare((char *)local_2d8);
    if (iVar5 != 0) goto LAB_001126d0;
    bVar17 = (local_408._M_dataplus._M_p + -1)[local_408._M_string_length] == '}';
  }
  if (((char *)0x5 < sVar4) && (local_2d8[0] != local_2c8)) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  if (bVar17) {
    std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_408);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_3c8,0,(char *)0x0,0x13311f);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      lVar13 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar13;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_3c8 != (undefined1  [8])local_3b8) {
      operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
    }
    goto LAB_00113cf7;
  }
  local_298 = __return_storage_ptr__;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\\left|","");
  src._M_str = _Var3._M_p;
  src._M_len = sVar4;
  to._M_str = "abs(";
  to._M_len = 4;
  util::str_replace((string *)local_3c8,src,&local_d0,to);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\\right|","");
  src_00._M_str = _Var3._M_p;
  src_00._M_len = sVar4;
  to_00._M_str = ")";
  to_00._M_len = 1;
  util::str_replace((string *)local_3c8,src_00,&local_f0,to_00);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"\\lfloor","");
  src_01._M_str = _Var3._M_p;
  src_01._M_len = sVar4;
  to_01._M_str = "floor(";
  to_01._M_len = 6;
  util::str_replace((string *)local_3c8,src_01,&local_110,to_01);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\rfloor","");
  src_02._M_str = _Var3._M_p;
  src_02._M_len = sVar4;
  to_02._M_str = ")";
  to_02._M_len = 1;
  util::str_replace((string *)local_3c8,src_02,&local_130,to_02);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"\\lceil|","");
  src_03._M_str = _Var3._M_p;
  src_03._M_len = sVar4;
  to_03._M_str = "ceil(";
  to_03._M_len = 5;
  util::str_replace((string *)local_3c8,src_03,&local_150,to_03);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\\rceil|","");
  src_04._M_str = _Var3._M_p;
  src_04._M_len = sVar4;
  to_04._M_str = ")";
  to_04._M_len = 1;
  util::str_replace((string *)local_3c8,src_04,&local_170,to_04);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"\\left","");
  src_05._M_str = _Var3._M_p;
  src_05._M_len = sVar4;
  util::str_replace((string *)local_3c8,src_05,&local_190,(string_view)(ZEXT816(0x1344a1) << 0x40));
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\\right","");
  src_06._M_str = _Var3._M_p;
  src_06._M_len = sVar4;
  util::str_replace((string *)local_3c8,src_06,&local_1b0,(string_view)(ZEXT816(0x1344a1) << 0x40));
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\\cdot","");
  src_07._M_str = _Var3._M_p;
  src_07._M_len = sVar4;
  to_05._M_str = "*";
  to_05._M_len = 1;
  util::str_replace((string *)local_3c8,src_07,&local_1d0,to_05);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\\le","");
  src_08._M_str = _Var3._M_p;
  src_08._M_len = sVar4;
  to_06._M_str = "<=";
  to_06._M_len = 2;
  util::str_replace((string *)local_3c8,src_08,&local_1f0,to_06);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\\ge","");
  src_09._M_str = _Var3._M_p;
  src_09._M_len = sVar4;
  to_07._M_str = ">=";
  to_07._M_len = 2;
  util::str_replace((string *)local_3c8,src_09,&local_210,to_07);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"\\ne","");
  src_10._M_str = _Var3._M_p;
  src_10._M_len = sVar4;
  to_08._M_str = "!=";
  to_08._M_len = 2;
  util::str_replace((string *)local_3c8,src_10,&local_230,to_08);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"\\operatorname{and}","");
  src_11._M_str = _Var3._M_p;
  src_11._M_len = sVar4;
  to_09._M_str = "&";
  to_09._M_len = 1;
  util::str_replace((string *)local_3c8,src_11,&local_250,to_09);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"\\operatorname{or}","");
  src_12._M_str = _Var3._M_p;
  src_12._M_len = sVar4;
  to_10._M_str = "|";
  to_10._M_len = 1;
  util::str_replace((string *)local_3c8,src_12,&local_270,to_10);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_408._M_string_length;
  _Var3._M_p = local_408._M_dataplus._M_p;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\\operatorname{at}","");
  src_13._M_str = _Var3._M_p;
  src_13._M_len = sVar4;
  to_11._M_str = "@";
  to_11._M_len = 1;
  util::str_replace((string *)local_3c8,src_13,&local_290,to_11);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,
             "\\\\operatorname\\{(.+?)\\}",0x10);
  local_3c0._M_p = (pointer)0x0;
  local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
  local_3c8 = (undefined1  [8])local_3b8;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_408._M_dataplus._M_p,
             (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,"\\$1 ",4,0);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,
             "\\\\text\\{(.+?)\\}",0x10);
  local_3c0._M_p = (pointer)0x0;
  local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
  local_3c8 = (undefined1  [8])local_3b8;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_408._M_dataplus._M_p,
             (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,"$1",2,0);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8);
  lVar13 = 0;
  do {
    pcVar8 = (char *)strlen(*(char **)((long)latex_to_nivalis::SPECIAL_COMMANDS + lVar13));
    if (((pcVar8 < local_408._M_string_length) && (*local_408._M_dataplus._M_p == '\\')) &&
       (iVar5 = std::__cxx11::string::compare((ulong)&local_408,1,pcVar8), iVar5 == 0)) {
      *local_408._M_dataplus._M_p = '%';
    }
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x70);
  local_3c8 = (undefined1  [8])local_3b8;
  std::__cxx11::string::_M_construct((ulong)local_3c8,'\x01');
  std::__cxx11::string::reserve((ulong)local_3c8);
  if ((char *)0x1 < local_408._M_string_length) {
    pcVar8 = (char *)0x1;
    do {
      cVar15 = (char)local_3c8;
      if ((local_408._M_dataplus._M_p[(long)pcVar8] != '{') &&
         (((local_408._M_dataplus._M_p + -1)[(long)pcVar8] & 0xfeU) == 0x5e)) {
        std::__cxx11::string::push_back(cVar15);
        std::__cxx11::string::push_back(cVar15);
      }
      std::__cxx11::string::push_back(cVar15);
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 < local_408._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,
             "\\\\(sin|cos|tan)( *?)\\^\\{-1\\}",0x10);
  local_3c0._M_p = (pointer)0x0;
  local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
  local_3c8 = (undefined1  [8])local_3b8;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_408._M_dataplus._M_p,
             (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,"\\arc$1 ",7,0);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,
             "\\\\frac\\{d\\}\\{d([a-zA-Z][a-zA-Z_0-9\\{\\}]*?)\\}",0x10);
  local_3c0._M_p = (pointer)0x0;
  local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
  local_3c8 = (undefined1  [8])local_3b8;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_408._M_dataplus._M_p,
             (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,"diff($1)\v",9,0);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8);
  lVar13 = *in_FS_OFFSET;
  anon_unknown_1::ParenRule::operator()(&local_b0,(ParenRule *)(lVar13 + -0x328),&local_408);
  anon_unknown_1::ParenRule::operator()(&local_90,(ParenRule *)(*in_FS_OFFSET + -0x430),&local_b0);
  anon_unknown_1::ParenRule::operator()(&local_70,(ParenRule *)(lVar13 + -0x3d8),&local_90);
  anon_unknown_1::ParenRule::operator()(&local_50,(ParenRule *)(lVar13 + -0x2d0),&local_70);
  anon_unknown_1::ParenRule::operator()(&local_2f8,(ParenRule *)(lVar13 + -0x278),&local_50);
  anon_unknown_1::ParenRule::operator()(&local_2b8,(ParenRule *)(lVar13 + -0x220),&local_2f8);
  anon_unknown_1::ParenRule::operator()(&local_3e8,(ParenRule *)(lVar13 + -0x380),&local_2b8);
  anon_unknown_1::ParenRule::operator()
            ((string *)local_3c8,(ParenRule *)(lVar13 + -0x1c8),&local_3e8);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3e8,'\x01');
  std::__cxx11::string::reserve((ulong)&local_3e8);
  c = *local_408._M_dataplus._M_p;
  bVar17 = false;
  local_3c8 = (undefined1  [8])0x0;
  local_3c0._M_p = local_3c0._M_p & 0xffffffff00000000;
  local_3b8._0_8_ = 0;
  local_3b8._8_4_ = 0;
  local_3b8._16_8_ = (_Bit_pointer)0x0;
  if ((char *)0x5 < local_408._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_408);
    iVar5 = std::__cxx11::string::compare((char *)&local_2b8);
    bVar17 = iVar5 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar17) {
    pcVar8 = (char *)std::__cxx11::string::find((char)&local_408,0x40);
    std::__cxx11::string::substr((ulong)&local_2f8,(ulong)&local_408);
LAB_00113692:
    std::__cxx11::string::operator=((string *)&local_3e8,(string *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar8 == (char *)0xffffffffffffffff) {
      pcVar8 = (char *)local_408._M_string_length;
    }
  }
  else {
    pcVar8 = (char *)0x1;
    if (((char *)0x1 < local_408._M_string_length) && (*local_408._M_dataplus._M_p == 0x25)) {
      pcVar8 = (char *)std::__cxx11::string::find((char)&local_408,0x20);
      std::__cxx11::string::substr((ulong)&local_2f8,(ulong)&local_408);
      goto LAB_00113692;
    }
  }
  if (pcVar8 < local_408._M_string_length) {
    lVar13 = 0;
    local_300 = 0x800000000000003f;
    do {
      bVar1 = local_408._M_dataplus._M_p[(long)pcVar8];
      iVar5 = isspace((int)(char)bVar1);
      if (((char)bVar1 == 0xb) || (iVar5 == 0)) {
        if (bVar1 == 0x7d) {
          uVar11 = (ulong)(uint)local_3b8._8_4_;
          if ((local_3b8._0_8_ - (long)local_3c8) * 8 + uVar11 != 0) {
            uVar9 = uVar11 - 1;
            uVar14 = uVar11 + 0x3e;
            if (-1 < (long)uVar9) {
              uVar14 = uVar9;
            }
            lVar13 = lVar13 - (ulong)((*(ulong *)(local_3b8._0_8_ + ((long)uVar14 >> 6) * 8 + -8 +
                                                 (ulong)((uVar9 & local_300) < 0x8000000000000001) *
                                                 8) >> (uVar9 & 0x3f) & 1) != 0);
            local_3b8._8_4_ = local_3b8._8_4_ - 1;
            if (uVar11 == 0) {
              local_3b8._8_4_ = 0x3f;
              local_3b8._0_8_ = local_3b8._0_8_ - 8;
            }
          }
        }
        else if (bVar1 == 0x7b) {
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_3c8,c == 0x5f);
          uVar11 = (ulong)(uint)local_3b8._8_4_ - 1;
          uVar9 = (ulong)(uint)local_3b8._8_4_ + 0x3e;
          if (-1 < (long)uVar11) {
            uVar9 = uVar11;
          }
          lVar13 = lVar13 + (ulong)((*(ulong *)(((long)uVar9 >> 6) * 8 + local_3b8._0_8_ + -8 +
                                               (ulong)((uVar11 & local_300) < 0x8000000000000001) *
                                               8) >> (uVar11 & 0x3f) & 1) != 0);
        }
        uVar16 = (uint)c;
        if (((local_408._M_dataplus._M_p[(long)pcVar8] != 0x5c) ||
            ((pcVar8 + 1 != (char *)local_408._M_string_length &&
             (((local_408._M_dataplus._M_p + 1)[(long)pcVar8] == 0x20 ||
              ((local_408._M_dataplus._M_p + 1)[(long)pcVar8] == 0x7d)))))) ||
           (bVar17 = util::is_operator(c), bVar17)) {
          if (((c == 0x29) || (uVar16 == 0x7d)) || (uVar16 == 0x5d)) {
            bVar1 = local_408._M_dataplus._M_p[(long)pcVar8];
            bVar17 = util::is_operator(bVar1);
            if (!bVar17) {
              uVar6 = bVar1 - 0xb;
              if ((0x35 < uVar6) || ((0x20800240000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
                uVar6 = bVar1 - 0x5c;
                if (uVar6 < 0x22) {
                  uVar11 = 0x20000000b;
                  goto LAB_0011391f;
                }
                goto LAB_00113a73;
              }
            }
          }
LAB_00113929:
          bVar1 = local_408._M_dataplus._M_p[(long)pcVar8];
          uVar6 = (uint)c;
          if (((((bVar1 != 0x28) && (bVar1 != 0x7b)) && (bVar1 != 0x5b)) ||
              (bVar17 = util::is_operator(c), bVar17)) ||
             (((uVar16 - 0xb < 0x36 &&
               ((0x20800220000001U >> ((ulong)(uVar16 - 0xb) & 0x3f) & 1) != 0)) ||
              ((uVar6 - 0x5b < 0x21 && ((0x100000013U >> ((ulong)(uVar6 - 0x5b) & 0x3f) & 1) != 0)))
              ))) {
            if (((lVar13 == 0) &&
                ((((bVar1 = local_408._M_dataplus._M_p[(long)pcVar8],
                   (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a ||
                   ((bVar1 - 0x24 < 0x3d &&
                    ((0x1800000010000009U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0)))) ||
                  (bVar1 == 0x2e || (byte)(bVar1 - 0x30) < 10)) && ((c != 0x24 && (uVar6 != 0x40))))
                )) && ((((byte)((c & 0xdf) + 0xbf) < 0x1a ||
                        (((uVar6 - 0x24 < 0x3d &&
                          ((0x1800000010000009U >> ((ulong)(uVar6 - 0x24) & 0x3f) & 1) != 0)) ||
                         (c == 0x2e || (byte)(c - 0x30) < 10)))) &&
                       ((c == 0x2e || (byte)(c - 0x30) < 10) !=
                        (bVar1 == 0x2e || (byte)(bVar1 - 0x30) < 10))))) goto LAB_00113a73;
          }
          else {
            iVar5 = isalpha((int)(char)c);
            if ((iVar5 == 0) || (local_408._M_dataplus._M_p[(long)pcVar8] != 0x28))
            goto LAB_00113a73;
          }
        }
        else {
          if ((uVar16 - 0xb < 0x36) &&
             ((0x20800220000001U >> ((ulong)(uVar16 - 0xb) & 0x3f) & 1) != 0)) goto LAB_00113929;
          uVar6 = uVar16 - 0x5b;
          if (uVar6 < 0x21) {
            uVar11 = 0x100000013;
LAB_0011391f:
            if ((uVar11 >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto LAB_00113929;
          }
LAB_00113a73:
          std::__cxx11::string::push_back((char)&local_3e8);
        }
        c = local_408._M_dataplus._M_p[(long)pcVar8];
        if (c != 0xb) {
          std::__cxx11::string::push_back((char)&local_3e8);
        }
      }
      else {
        std::__cxx11::string::push_back((char)&local_3e8);
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 < local_408._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&local_408,(string *)&local_3e8);
  if (local_3c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3c8,local_3b8._16_8_ - (long)local_3c8);
    local_3c8 = (undefined1  [8])0x0;
    local_3c0._M_p = local_3c0._M_p & 0xffffffff00000000;
    local_3b8._0_8_ = 0;
    local_3b8._8_4_ = 0;
    local_3b8._16_8_ = (_Bit_pointer)0x0;
  }
  __return_storage_ptr__ = local_298;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,"_\\{(.+?)\\}\\*?",
             0x10);
  local_3c0._M_p = (pointer)0x0;
  local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
  local_3c8 = (undefined1  [8])local_3b8;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_408._M_dataplus._M_p,
             (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8,"$1",2,0);
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_3e8);
  local_3c0._M_p = (pointer)0x0;
  local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
  local_3c8 = (undefined1  [8])local_3b8;
  std::__cxx11::string::reserve((ulong)local_3c8);
  if ((char *)local_408._M_string_length != (char *)0x0) {
    pcVar8 = (char *)0x0;
    do {
      if (local_408._M_dataplus._M_p[(long)pcVar8] != '\\') {
        std::__cxx11::string::push_back((char)local_3c8);
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 < local_408._M_string_length);
  }
  std::__cxx11::string::operator=((string *)&local_408,(string *)local_3c8);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p == &local_408.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,local_408.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_408.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_408._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,local_408.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_408._M_string_length;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
LAB_00113cf7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                             local_408.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string latex_to_nivalis(const std::string& expr_in) {
#define NO_IMPLICIT_MULT "\v" // Special character used to indicate we should not add * here
    thread_local ParenRule
        l2n_nthroot { "\\sqrt", {'[', '{'},  // Input spec: prefix, paren types (end paren inferred)
            {"(", 1, ")^(1/(", 0, "))"} },   // Output spec: output arg order
        l2n_sqrt { "\\sqrt", {'{'},
            {"sqrt(", 0, ")"} },
        l2n_frac { "\\frac", {'{', '{'},
            {"((", 0, ")/(", 1, "))"} },
        l2n_logbase { "\\log_", {'{', '('},
            {"log(", 1, ", ", 0, ")"} },
        l2n_sum { "\\sum_", {'{', '^'},
            {"sum(", 0, ", ", 1, ")\v"} },
        l2n_prod { "\\prod_", {'{', '^'},
            {"prod(", 0, ", ", 1, ")\v"} },
        l2n_int { "\\int_", {'{', '^'},
            {"int(", 0, ", ", 1, ")\v"} },
        l2n_choose { "\\binom", {'{', '{'},
            {"choose(", 0, ", ", 1, ")"} };

    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr.size() >= 6 && expr.substr(0, 6) == "\\text{" &&
           expr.back() == '}') {
        // Comment
        return "#" + expr.substr(6, expr.size() - 7);
    }

    expr = util::str_replace(expr, "\\left|", "abs(");
    expr = util::str_replace(expr, "\\right|", ")");
    expr = util::str_replace(expr, "\\lfloor", "floor(");
    expr = util::str_replace(expr, "\\rfloor", ")");
    expr = util::str_replace(expr, "\\lceil|", "ceil(");
    expr = util::str_replace(expr, "\\rceil|", ")");
    expr = util::str_replace(expr, "\\left", "");
    expr = util::str_replace(expr, "\\right", "");
    expr = util::str_replace(expr, "\\cdot", "*");
    expr = util::str_replace(expr, "\\le", "<=");
    expr = util::str_replace(expr, "\\ge", ">=");
    expr = util::str_replace(expr, "\\ne", "!=");
    expr = util::str_replace(expr, "\\operatorname{and}", "&");
    expr = util::str_replace(expr, "\\operatorname{or}", "|");
    expr = util::str_replace(expr, "\\operatorname{at}", "@");

    static const char*  SPECIAL_COMMANDS[] = {
        "poly", "fpoly", "Fpoly",
        "rect", "frect", "Frect",
        "circ", "fcirc", "Fcirc",
        "ellipse", "fellipse", "Fellipse",
        "text",
        "mandelbrot"
    };

    // Remove operatorname
    expr = std::regex_replace(expr,
            std::regex(R"(\\operatorname\{(.+?)\})"), "\\$1 ");

    // Remove text{}
    expr = std::regex_replace(expr,
            std::regex(R"(\\text\{(.+?)\})"), "$1");

    // Remap drawing commands
    for (size_t i = 0; i < sizeof(SPECIAL_COMMANDS) / sizeof(SPECIAL_COMMANDS[0]); ++i) {
        const size_t len = strlen(SPECIAL_COMMANDS[i]);
        if (expr.size() > len &&
                expr[0] == '\\' && expr.compare(1, len, SPECIAL_COMMANDS[i]) == 0) {
            expr[0] = '%';
        }
    }

    {
        std::string tmp(1, expr[0]);
        // Add braces so that x^22 -> x^{2}2,
        //                  log_22 -> log_{2}2
        tmp.reserve(expr.size());
        for (size_t i = 1; i < expr.size(); ++i) {
            if (expr[i] != '{' && (expr[i-1] == '_' || expr[i-1] == '^')) {
                tmp.push_back('{');
                tmp.push_back(expr[i]);
                tmp.push_back('}');
            } else {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }

    // Map (sin/cos/tan)^{-1} -> arg(..)
    expr = std::regex_replace(expr,
            std::regex(R"(\\(sin|cos|tan)( *?)\^\{-1\})"), "\\arc$1 ");

    // Diff
    expr = std::regex_replace(expr,
            std::regex(R"(\\frac\{d\}\{d([a-zA-Z][a-zA-Z_0-9\{\}]*?)\})"), "diff($1)" NO_IMPLICIT_MULT);

    // Apply parenthesis-based rules
    expr = l2n_choose(l2n_frac(l2n_int(
                    l2n_prod(l2n_sum(l2n_sqrt(
                                l2n_nthroot(l2n_logbase(expr))
                    )))
            )));

    // Implicit multiply
    {
        std::string tmp(1, expr[0]); tmp.reserve(expr.size());
        char last_nonspace = expr[0];
        std::vector<bool> brace_subs;
        size_t sub_level = 0; // subscript level

        auto is_opchar = [](char c, bool allow_open_brkt, bool allow_close_brkt) {
            return util::is_operator(c) ||
                util::is_control(c) ||
                (!allow_open_brkt && util::is_open_bracket(c)) ||
                (!allow_close_brkt && util::is_close_bracket(c)) ||
                c == '_' ||
                c == NO_IMPLICIT_MULT[0];
        };
        size_t i = 1;
        if (expr.size() > 5 && expr.substr(0, 5) == "%text") {
            i = expr.find('@');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        } else if (expr.size() > 1 && expr[0] == '%') {
            i = expr.find(' ');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        }
        for (; i < expr.size(); ++i) {
            if (std::isspace(expr[i]) && expr[i] != NO_IMPLICIT_MULT[0]) {
                tmp.push_back(expr[i]);
                continue;
            }
            if (expr[i] == '{') {
                brace_subs.push_back(last_nonspace == '_');
                if (brace_subs.back()) sub_level++;
            } else if (expr[i] == '}') {
                if (brace_subs.size()) {
                    if (brace_subs.back()) sub_level--;
                    brace_subs.pop_back();
                }
            }
            if ((expr[i] == '\\' &&
                    (i + 1 == expr.size() ||
                     (expr[i+1] != '}' && expr[i+1] != ' ')) && // not '\}' or '\ '
                    !is_opchar(last_nonspace, false, true)) ||
                (util::is_close_bracket(last_nonspace) &&
                    !is_opchar(expr[i], true, false))) {
                tmp.push_back('*');
            } else if (util::is_open_bracket(expr[i]) &&
                    !is_opchar(last_nonspace, false, true)){
                if (!std::isalpha(last_nonspace) || expr[i] != '(')  // not beginning of call
                    tmp.push_back('*');
            } else if (sub_level == 0 &&
                       util::is_identifier(expr[i]) && last_nonspace != '$' && last_nonspace != '@' &&
                       util::is_identifier(last_nonspace) &&
                       util::is_numeric(expr[i]) !=
                       util::is_numeric(last_nonspace)) {
                tmp.push_back('*');
            }
            last_nonspace = expr[i];
            if (expr[i] != NO_IMPLICIT_MULT[0])
                tmp.push_back(expr[i]);
        }
        expr = std::move(tmp);
    }

    // Subscript
    expr = std::regex_replace(expr,
            std::regex(R"(_\{(.+?)\}\*?)"), "$1");

    // Remove any remaining backslashes, convert {}
    {
        std::string tmp; tmp.reserve(expr.size());
        for (size_t i = 0; i < expr.size(); ++i) {
            if (expr[i] == '{' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back('(');
            } else if (expr[i] == '}' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back(')');
            } else if (expr[i] != '\\') {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }
    return expr;
}